

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.hpp
# Opt level: O1

void readHosts(string *filePath,Hosts *hosts)

{
  int port_00;
  istream *piVar1;
  int port;
  string userName;
  string host;
  string displayName;
  ifstream ifs;
  int local_36c;
  undefined1 *local_368;
  long local_360;
  undefined1 local_358 [16];
  undefined1 *local_348;
  long local_340;
  undefined1 local_338 [16];
  undefined1 *local_328;
  long local_320;
  undefined1 local_318 [16];
  Hosts *local_308;
  string local_300;
  string local_2e0;
  string local_2c0;
  Host local_2a0;
  istream local_238 [520];
  
  local_308 = hosts;
  std::ifstream::ifstream(local_238,(string *)filePath,_S_in);
  local_328 = local_318;
  local_320 = 0;
  local_318[0] = 0;
  local_348 = local_338;
  local_340 = 0;
  local_338[0] = 0;
  local_368 = local_358;
  local_360 = 0;
  local_358[0] = 0;
  while( true ) {
    piVar1 = std::operator>>(local_238,(string *)&local_328);
    piVar1 = std::operator>>(piVar1,(string *)&local_348);
    piVar1 = (istream *)std::istream::operator>>(piVar1,&local_36c);
    piVar1 = std::operator>>(piVar1,(string *)&local_368);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_2e0,local_328,local_328 + local_320);
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_300,local_348,local_348 + local_340);
    port_00 = local_36c;
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_2c0,local_368,local_368 + local_360);
    Host::Host(&local_2a0,&local_2e0,&local_300,port_00,&local_2c0);
    std::vector<Host,_std::allocator<Host>_>::emplace_back<Host>(local_308,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0.userName._M_dataplus._M_p != &local_2a0.userName.field_2) {
      operator_delete(local_2a0.userName._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0.address._M_dataplus._M_p != &local_2a0.address.field_2) {
      operator_delete(local_2a0.address._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0.displayName._M_dataplus._M_p != &local_2a0.displayName.field_2) {
      operator_delete(local_2a0.displayName._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
  }
  if (local_368 != local_358) {
    operator_delete(local_368);
  }
  if (local_348 != local_338) {
    operator_delete(local_348);
  }
  if (local_328 != local_318) {
    operator_delete(local_328);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void readHosts(std::string filePath, Hosts &hosts) {
    std::ifstream ifs(filePath, std::ifstream::in);
    std::string displayName, host, userName;
    int port;
    while (ifs >> displayName >> host >> port >> userName) {
        hosts.emplace_back(Host(displayName, host, port, userName));
    }
}